

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O1

bool find_chibi_build_root(char *source_path,char *build_root,int build_root_size)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  char current_path [4096];
  char root_path [4096];
  char local_2038 [4096];
  char local_1038;
  char acStack_1037 [4103];
  
  cVar1 = *source_path;
  bVar6 = cVar1 == '\0';
  if (bVar6) {
    pcVar2 = local_2038;
  }
  else {
    lVar4 = 0;
    do {
      lVar5 = lVar4;
      local_2038[lVar5] = cVar1;
      cVar1 = source_path[lVar5 + 1];
      if (cVar1 == '\0') break;
      lVar4 = lVar5 + 1;
    } while ((int)lVar5 != 0xfff);
    bVar6 = (int)(lVar5 + 1) != 0x1000 && cVar1 == '\0';
    pcVar2 = local_2038 + lVar5 + 1;
  }
  if (bVar6) {
    *pcVar2 = '\0';
    if (build_root_size < 1) {
      __assert_fail("build_root_size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marcel303[P]chibi/chibi.cpp"
                    ,0x59e,"bool find_chibi_build_root(const char *, char *, const int)");
    }
    *build_root = '\0';
    do {
      bVar6 = chibi::concat(&local_1038,0x1000,local_2038,"/chibi-root.txt",(char *)0x0,(char *)0x0)
      ;
      if (bVar6) {
        bVar6 = file_exist(&local_1038);
        if (bVar6) {
          bVar6 = local_1038 == '\0';
          pcVar2 = build_root;
          if (!bVar6) {
            lVar4 = 0;
            cVar1 = local_1038;
            do {
              build_root[lVar4] = cVar1;
              lVar5 = lVar4 + 1;
              cVar1 = acStack_1037[lVar4];
              if (cVar1 == '\0') break;
              iVar3 = (int)lVar4;
              lVar4 = lVar5;
            } while (build_root_size + -1 != iVar3);
            bVar6 = build_root_size != (int)lVar5 && cVar1 == '\0';
            pcVar2 = build_root + lVar5;
          }
          if (!bVar6) {
            pcVar2 = "failed to copy path";
            goto LAB_00108da4;
          }
          *pcVar2 = '\0';
        }
        pcVar2 = strrchr(local_2038,0x2f);
        if (pcVar2 == (char *)0x0) {
          iVar3 = 2;
        }
        else {
          *pcVar2 = '\0';
          iVar3 = 0;
        }
      }
      else {
        pcVar2 = "failed to create absolute path";
LAB_00108da4:
        report_error((char *)0x0,pcVar2);
        iVar3 = 1;
      }
    } while (iVar3 == 0);
    if (iVar3 == 2) {
      bVar6 = *build_root != '\0';
    }
    else {
      bVar6 = false;
    }
  }
  else {
    bVar6 = false;
    report_error((char *)0x0,"failed to copy path");
  }
  return bVar6;
}

Assistant:

bool find_chibi_build_root(const char * source_path, char * build_root, const int build_root_size)
{
	// recursively find build_root
	
	char current_path[PATH_MAX];
	if (!copy_string(current_path, sizeof(current_path), source_path))
	{
		report_error(nullptr, "failed to copy path");
		return false;
	}
	
	assert(build_root_size > 0);
	build_root[0] = 0;

	for (;;)
	{
		char root_path[PATH_MAX];
		if (!concat(root_path, sizeof(root_path), current_path, "/chibi-root.txt"))
		{
			report_error(nullptr, "failed to create absolute path");
			return false;
		}

		if (file_exist(root_path))
		{
			if (!copy_string(build_root, build_root_size, root_path))
			{
				report_error(nullptr, "failed to copy path");
				return false;
			}
		}
		
		char * term = strrchr(current_path, '/');

		if (term == nullptr)
			break;
		else
			*term = 0;
	}
	
	if (build_root[0] == 0)
		return false;
	
	return true;
}